

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

ZSTD_compressionParameters *
duckdb_zstd::ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_compressionParameters cPar;
  size_t sVar1;
  ZSTD_compressionParameters *pZVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 uStack_1c;
  
  sVar1 = 0;
  if (mode != ZSTD_cpm_attachDict) {
    sVar1 = dictSize;
  }
  uVar4 = 0xffffffffffffffff;
  if (srcSizeHint != 0xffffffffffffffff || sVar1 != 0) {
    lVar5 = 500;
    if (sVar1 == 0) {
      lVar5 = 0;
    }
    lVar6 = 0;
    if (srcSizeHint == 0xffffffffffffffff) {
      lVar6 = lVar5;
    }
    uVar4 = sVar1 + srcSizeHint + lVar6;
  }
  lVar5 = (ulong)(uVar4 < 0x20001) + (ulong)(uVar4 < 0x40001) + (ulong)(uVar4 < 0x4001);
  if (compressionLevel == 0) {
    uVar4 = 3;
  }
  else {
    if (compressionLevel < 0) {
      lVar6 = lVar5 * 0x284;
      local_38 = *(undefined4 *)(ZSTD_defaultCParameters + lVar6 + 0x10);
      local_48 = *(undefined8 *)(ZSTD_defaultCParameters + lVar6);
      uStack_40 = *(undefined8 *)(ZSTD_defaultCParameters + lVar6 + 8);
      iVar7 = -0x20000;
      if (0xfffe0000 < (uint)compressionLevel) {
        iVar7 = compressionLevel;
      }
      iVar7 = -iVar7;
      uVar4 = 0;
      goto LAB_01244c31;
    }
    uVar4 = 0x16;
    if ((uint)compressionLevel < 0x16) {
      uVar4 = (ulong)(uint)compressionLevel;
    }
  }
  lVar3 = lVar5 * 0x284;
  lVar6 = uVar4 * 0x1c;
  local_38 = *(undefined4 *)(lVar3 + 0x1480ae0 + lVar6);
  local_48 = *(undefined8 *)(ZSTD_defaultCParameters + lVar6 + lVar3);
  uStack_40 = *(undefined8 *)((long)(ZSTD_defaultCParameters + lVar6 + lVar3) + 8);
  iVar7 = *(int *)(lVar3 + 0x1480ae4 + lVar6);
LAB_01244c31:
  uStack_1c = (undefined4)((ulong)uStack_40 >> 0x20);
  cPar.strategy = *(undefined4 *)(lVar5 * 0x284 + 0x1480ae8 + uVar4 * 0x1c);
  cPar.targetLength = iVar7;
  cPar.hashLog = (int)uStack_40;
  cPar.windowLog = (undefined4)local_48;
  cPar.chainLog = local_48._4_4_;
  cPar.searchLog = uStack_1c;
  cPar.minMatch = local_38;
  pZVar2 = ZSTD_adjustCParams_internal
                     (__return_storage_ptr__,cPar,srcSizeHint,dictSize,mode,ZSTD_ps_auto);
  return pZVar2;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    U64 const rSize = ZSTD_getCParamRowSize(srcSizeHint, dictSize, mode);
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);

    /* row */
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    else if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    else if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    else row = compressionLevel;

    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        DEBUGLOG(5, "ZSTD_getCParams_internal selected tableID: %u row: %u strat: %u", tableID, row, (U32)cp.strategy);
        /* acceleration factor */
        if (compressionLevel < 0) {
            int const clampedCompressionLevel = MAX(ZSTD_minCLevel(), compressionLevel);
            cp.targetLength = (unsigned)(-clampedCompressionLevel);
        }
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize, mode, ZSTD_ps_auto);
    }
}